

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base.h
# Opt level: O1

int __thiscall
fructose::test_base<TestRingBuffer>::do_run(test_base<TestRingBuffer> *this,suite *suite)

{
  undefined8 uVar1;
  uint uVar2;
  long *plVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  runtime_error *this_00;
  size_type sVar6;
  pointer __k;
  code *pcVar7;
  string result;
  string title;
  pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
  value;
  char local_d1;
  test_base<TestRingBuffer> *local_d0;
  char *local_c8;
  long local_c0;
  char local_b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
  *local_88;
  suite *local_80;
  pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
  local_78;
  
  local_d0 = this;
  plVar3 = (long *)__dynamic_cast(this,&typeinfo,&TestRingBuffer::typeinfo,0);
  if (plVar3 == (long *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "problem in test set-up; probable cause: test container class not passed to test_base template"
              );
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __k = (suite->
        super__Vector_base<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (__k != (suite->
             super__Vector_base<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    local_88 = &local_d0->m_tests;
    local_80 = suite;
    do {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
               ::operator[](local_88,&__k->m_test_name);
      std::
      pair<void_(TestRingBuffer::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
      ::pair(&local_78,pmVar4);
      uVar1 = local_78._8_8_;
      pcVar7 = (code *)local_78.first;
      if ((code *)local_78.first == (code *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"No such test case: ",0x13);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(__k->m_test_name)._M_dataplus._M_p,
                            (__k->m_test_name)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      else {
        std::operator+(&local_a8,"Running test case ",&__k->m_test_name);
        if ((local_d0->super_test_root).m_verbose == true) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
          std::ostream::put('X');
          poVar5 = (ostream *)std::ostream::flush();
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_a8._M_dataplus._M_p,local_a8._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          poVar5 = (ostream *)std::ostream::flush();
          local_c8 = local_b8;
          local_c0 = 0;
          local_b8[0] = '\0';
          if (local_a8._M_string_length != 0) {
            sVar6 = 0;
            do {
              std::__cxx11::string::push_back((char)&local_c8);
              sVar6 = sVar6 + 1;
            } while (sVar6 != local_a8._M_string_length);
          }
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_c8,local_c0);
          local_d1 = '\n';
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_d1,1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          if (local_c8 != local_b8) {
            operator_delete(local_c8);
          }
        }
        (**(code **)(*plVar3 + 0x10))(plVar3);
        plVar3[2] = (long)__k;
        if (((ulong)pcVar7 & 1) != 0) {
          pcVar7 = *(code **)(pcVar7 + *(long *)(uVar1 + (long)plVar3) + -1);
        }
        (*pcVar7)((long *)(uVar1 + (long)plVar3),__k);
        (**(code **)(*plVar3 + 0x18))(plVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78.second.m_arguments);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.second.m_test_name._M_dataplus._M_p != &local_78.second.m_test_name.field_2) {
        operator_delete(local_78.second.m_test_name._M_dataplus._M_p);
      }
      __k = __k + 1;
    } while (__k != (local_80->
                    super__Vector_base<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
  }
  uVar2 = 1;
  if ((local_d0->super_test_root).m_error_count == 0) {
    uVar2 = (uint)(local_d0->super_test_root).m_exception_happened;
  }
  return uVar2;
}

Assistant:

inline int 
test_base<test_container>::do_run(const suite& suite) 
{
    test_container* runner = dynamic_cast<test_container*>(this);
    
    if (runner == 0)
    {
        throw std::runtime_error(
            "problem in test set-up; probable cause: "
            "test container class not passed to test_base template");
    }

    for (typename suite::const_iterator it = suite.begin(); it != suite.end(); ++it)
    {
        std::pair<test_case, test_info> value = m_tests[it->m_test_name];
        test_case test_case = value.first;
        if (test_case)
        {
            const std::string title = "Running test case " + it->m_test_name;
            if (verbose())
            {
                std::cout << std::endl << title << std::endl
                          << underline(title) << '\n' << std::endl;
            }
            runner->setup();
            runner->set_test_info(&(*it));
            try
            {
                (runner->*test_case)(it->m_test_name);    
                runner->teardown();
            }
            catch(std::exception& ex)
            {
                runner->teardown();
                set_exception_happened();
		std::cout << ex.what() << std::endl;
            }
        }
        else
        {
            std::cerr << "No such test case: " << it->m_test_name << std::endl;
        }
    }
    
    return return_status();
}